

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  ostream *this;
  TestPartResultArray *this_00;
  int iVar1;
  TestPartResult *pTVar2;
  AssertionResult *pAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  int index;
  char *pcVar5;
  undefined4 in_register_00000084;
  Type TVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar7;
  AssertionResult AVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  string expected;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertionResult local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  TVar6 = (Type)substr;
  this_00 = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar5 = "1 non-fatal failure";
  if (TVar6 == kFatalFailure) {
    pcVar5 = "1 fatal failure";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar5,pcVar5 + (ulong)(TVar6 != kFatalFailure) * 4 + 0xf);
  Message::Message((Message *)&local_68);
  sVar7.ptr_ = local_68.ptr_;
  if ((int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249 == 1) {
    pTVar2 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar2->type_ == TVar6) {
      pcVar5 = strstr((pTVar2->message_)._M_dataplus._M_p,(in_stack_00000008->_M_dataplus)._M_p);
      if (pcVar5 != (char *)0x0) {
        *param_1 = '\x01';
        param_1[8] = '\0';
        param_1[9] = '\0';
        param_1[10] = '\0';
        param_1[0xb] = '\0';
        param_1[0xc] = '\0';
        param_1[0xd] = '\0';
        param_1[0xe] = '\0';
        param_1[0xf] = '\0';
        sVar4.ptr_ = extraout_RDX;
        goto LAB_00108f31;
      }
      local_60.success_ = false;
      local_60.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_60,(char (*) [11])0x129215);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,in_stack_00000008);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x1299e9);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
    }
    else {
      local_60.success_ = false;
      local_60.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_60,(char (*) [11])0x129215);
      pAVar3 = AssertionResult::operator<<(pAVar3,&local_50);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x129930);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
    }
  }
  else {
    this = (ostream *)(local_68.ptr_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(this,"Expected: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (this,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(this,"  Actual: ",10);
    std::ostream::operator<<
              ((ostream *)this,
               (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249);
    std::__ostream_insert<char,std::char_traits<char>>(this," failures",9);
    if (0 < (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4) * -0x49249249) {
      index = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(sVar7.ptr_ + 0x10),"\n",1);
        pTVar2 = TestPartResultArray::GetTestPartResult(this_00,index);
        sVar7.ptr_ = local_68.ptr_;
        testing::operator<<((ostream *)(local_68.ptr_ + 0x10),pTVar2);
        index = index + 1;
        iVar1 = (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 4);
      } while (SBORROW4(index,iVar1 * -0x49249249) != index + iVar1 * 0x49249249 < 0);
    }
    local_60.success_ = false;
    local_60.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<(&local_60,(Message *)&local_68);
    AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar3);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar4.ptr_ = extraout_RDX_00;
LAB_00108f31:
  if (local_68.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_68.ptr_ + 8))();
    sVar4.ptr_ = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    sVar4.ptr_ = extraout_RDX_02;
  }
  AVar8.message_.ptr_ = sVar4.ptr_;
  AVar8._0_8_ = param_1;
  return AVar8;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const std::string expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}